

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
emplaceRealloc<slang::ast::RecursiveStructMemberIterator::State&>
          (SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *this,pointer pos,
          State *args)

{
  undefined8 *puVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  ulong uVar4;
  pointer p;
  size_type sVar5;
  ConstantValue *pCVar6;
  Type *pTVar7;
  FieldSymbol **ppFVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer pSVar12;
  pointer pSVar13;
  pointer pSVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar4 = this->cap;
  if (uVar16 < uVar4 * 2) {
    uVar16 = uVar4 * 2;
  }
  if (0x333333333333333 - uVar4 < uVar4) {
    uVar16 = 0x333333333333333;
  }
  lVar17 = (long)pos - (long)this->data_;
  pSVar14 = (pointer)operator_new(uVar16 * 0x28);
  *(FieldSymbol ***)((long)pSVar14 + lVar17 + 0x20) = (args->fieldEnd)._M_current;
  pCVar6 = args->val;
  pTVar7 = args->type;
  ppFVar8 = (args->fieldIt)._M_current;
  psVar2 = (size_t *)((long)pSVar14 + lVar17 + 0x10);
  *psVar2 = args->valIndex;
  psVar2[1] = (size_t)ppFVar8;
  *(undefined8 *)((long)pSVar14 + lVar17) = pCVar6;
  ((undefined8 *)((long)pSVar14 + lVar17))[1] = pTVar7;
  p = this->data_;
  sVar5 = this->len;
  lVar15 = (long)p + (sVar5 * 0x28 - (long)pos);
  pSVar12 = p;
  pSVar13 = pSVar14;
  if (lVar15 == 0) {
    if (sVar5 != 0) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)&(pSVar14->fieldEnd)._M_current + lVar15) =
             *(undefined8 *)((long)&(p->fieldEnd)._M_current + lVar15);
        puVar1 = (undefined8 *)((long)&p->val + lVar15);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        puVar1 = (undefined8 *)((long)&p->valIndex + lVar15);
        uVar11 = puVar1[1];
        puVar3 = (undefined8 *)((long)&pSVar14->valIndex + lVar15);
        *puVar3 = *puVar1;
        puVar3[1] = uVar11;
        puVar1 = (undefined8 *)((long)&pSVar14->val + lVar15);
        *puVar1 = uVar9;
        puVar1[1] = uVar10;
        lVar15 = lVar15 + 0x28;
      } while (sVar5 * 0x28 != lVar15);
    }
  }
  else {
    for (; pSVar12 != pos; pSVar12 = pSVar12 + 1) {
      (pSVar13->fieldEnd)._M_current = (pSVar12->fieldEnd)._M_current;
      pCVar6 = pSVar12->val;
      pTVar7 = pSVar12->type;
      ppFVar8 = (pSVar12->fieldIt)._M_current;
      pSVar13->valIndex = pSVar12->valIndex;
      (pSVar13->fieldIt)._M_current = ppFVar8;
      pSVar13->val = pCVar6;
      pSVar13->type = pTVar7;
      pSVar13 = pSVar13 + 1;
    }
    memcpy((void *)((long)pSVar14 + lVar17 + 0x28),pos,((lVar15 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pSVar14;
  return (pointer)((long)pSVar14 + lVar17);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}